

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,big_decimal_fp *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  int iVar1;
  size_type sVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar6;
  uint uVar7;
  sign_t sVar8;
  ulong uVar9;
  size_t __n;
  char cVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  byte *__s;
  byte *pbVar18;
  byte bVar19;
  int num_zeros;
  sign_t sign;
  int significand_size;
  char *significand;
  int exp;
  anon_class_40_7_ef14d3db write;
  undefined1 local_ad [5];
  sign_t local_a8;
  int local_a4;
  char **local_a0;
  undefined1 local_94 [20];
  char **local_80;
  undefined1 local_78 [16];
  anon_class_56_7_a2a26a24 local_68;
  
  local_a0 = (char **)fp->significand;
  uVar9 = (ulong)fspecs >> 0x28 & 0xff;
  iVar1 = fp->significand_size;
  local_94._4_8_ = SEXT48(iVar1);
  sVar8 = (sign_t)uVar9;
  local_ad[0] = decimal_point;
  local_a8 = sVar8;
  local_a4 = iVar1;
  local_78._0_8_ = fspecs;
  if (-1 < (long)local_94._4_8_) {
    uVar13 = fp->exponent;
    uVar16 = (ulong)((iVar1 + 1) - (uint)(sVar8 == none));
    local_94._0_4_ = uVar13 + iVar1;
    uVar7 = fspecs.precision;
    uVar12 = fspecs._4_4_;
    if (fspecs._4_1_ == '\x01') {
LAB_0012da21:
      iVar4 = (uVar13 - 1) + iVar1;
      if ((uVar12 >> 0x14 & 1) == 0) {
        local_94._12_8_ = 0;
        uVar11 = (ulong)(byte)decimal_point;
        if (iVar1 == 1) {
          uVar11 = local_94._12_8_;
        }
        cVar10 = (char)uVar11;
      }
      else {
        local_94._12_8_ = ZEXT48(~((int)(uVar7 - iVar1) >> 0x1f) & uVar7 - iVar1);
        uVar16 = uVar16 + local_94._12_8_;
        cVar10 = decimal_point;
      }
      local_68.sign = (sign_t *)CONCAT44(local_68.sign._4_4_,sVar8);
      local_68.significand_size._0_5_ = CONCAT14(cVar10,iVar1);
      iVar3 = 1 - local_94._0_4_;
      if (0 < (int)local_94._0_4_) {
        iVar3 = iVar4;
      }
      lVar14 = 2;
      if (99 < iVar3) {
        lVar14 = (ulong)(999 < iVar3) + 3;
      }
      sVar5 = (3 - (ulong)(cVar10 == '\0')) + uVar16 + lVar14;
      bVar19 = ((uVar12 >> 0x10 & 1) == 0) << 5;
      local_68.fp = (big_decimal_fp *)
                    (CONCAT35(local_68.fp._5_3_,CONCAT14(bVar19,(int)local_94._12_8_)) |
                    0x4500000000);
      local_68.fspecs = (float_specs *)CONCAT44(local_68.fspecs._4_4_,iVar4);
      local_68.significand = local_a0;
      if (0 < specs->width) {
        bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_1_&>
                          (out,specs,sVar5,sVar5,(anon_class_40_7_ef14d3db *)&local_68);
        return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )bVar6.container;
      }
      sVar2 = (out.container)->_M_string_length;
      local_80 = local_a0;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (out.container,sVar5 + sVar2,'\0');
      pcVar17 = ((out.container)->_M_dataplus)._M_p + sVar2;
      if (sVar8 != none) {
        *pcVar17 = *(char *)((long)&basic_data<void>::signs + uVar9);
        pcVar17 = pcVar17 + 1;
      }
      *pcVar17 = *(char *)local_80;
      uVar13 = (uint)local_94._12_8_;
      local_78._8_8_ = out.container;
      if (cVar10 == '\0') {
        __s = (byte *)(pcVar17 + 1);
      }
      else {
        pcVar17[1] = cVar10;
        __n = local_94._4_8_ - 1;
        if (iVar1 != 1) {
          memmove(pcVar17 + 2,(char *)((long)local_80 + 1),__n);
          uVar13 = (uint)local_94._12_8_;
        }
        __s = (byte *)(pcVar17 + 2 + __n);
      }
      pbVar18 = __s;
      if (uVar13 != 0) {
        pbVar18 = __s + uVar13;
        memset(__s,0x30,(ulong)uVar13);
      }
      *pbVar18 = bVar19 | 0x45;
      write_exponent<char,char*>((int)local_68.fspecs,(char *)(pbVar18 + 1));
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_;
    }
    if (((ulong)fspecs & 0xff00000000) == 0) {
      uVar15 = 0x10;
      if (0 < (int)uVar7) {
        uVar15 = uVar7;
      }
      if (((int)local_94._0_4_ < -3) || ((int)uVar15 < (int)local_94._0_4_)) goto LAB_0012da21;
    }
    if (-1 < (int)uVar13) {
      local_ad._1_4_ = uVar7 - local_94._0_4_;
      sVar5 = uVar13 + uVar16;
      if ((uVar12 >> 0x14 & 1) != 0) {
        if (fspecs._4_1_ == '\x02' || 0 < (int)local_ad._1_4_) {
          if ((int)local_ad._1_4_ < 1) goto LAB_0012dbec;
        }
        else {
          local_ad._1_4_ = 1;
        }
        sVar5 = sVar5 + (uint)local_ad._1_4_;
      }
LAB_0012dbec:
      local_68.sign = &local_a8;
      local_68.significand = (char **)&local_a0;
      local_68.significand_size = &local_a4;
      local_68.fspecs = (float_specs *)local_78;
      local_68.decimal_point = local_ad;
      local_68.num_zeros = (int *)(local_ad + 1);
      local_68.fp = fp;
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_2_&>
                        (out,specs,sVar5,sVar5,&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
    if (0 < (int)local_94._0_4_) {
      local_68.decimal_point = local_ad + 1;
      local_68.sign = &local_a8;
      local_68.significand = (char **)&local_a0;
      local_ad._1_4_ = uVar7 - iVar1 & (int)(uVar12 << 0xb) >> 0x1f;
      local_68.significand_size = &local_a4;
      local_68.fp = (big_decimal_fp *)local_94;
      local_68.fspecs = (float_specs *)local_ad;
      sVar5 = (ulong)(uint)(~((int)local_ad._1_4_ >> 0x1f) & local_ad._1_4_) + 1 + uVar16;
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_3_&>
                        (out,specs,sVar5,sVar5,(anon_class_48_6_48d028d1 *)&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
    uVar13 = -local_94._0_4_;
    local_ad._1_4_ = uVar13;
    if (SBORROW4(uVar7,uVar13) != (int)(uVar7 + local_94._0_4_) < 0) {
      local_ad._1_4_ = uVar7;
    }
    if ((int)uVar7 < 0) {
      local_ad._1_4_ = uVar13;
    }
    if (iVar1 != 0) {
      local_ad._1_4_ = uVar13;
    }
    if (-1 < (int)local_ad._1_4_) {
      sVar5 = (ulong)(uint)local_ad._1_4_ + 2 + uVar16;
      local_68.sign = &local_a8;
      local_68.significand = (char **)(local_ad + 1);
      local_68.significand_size = &local_a4;
      local_68.fp = (big_decimal_fp *)local_78;
      local_68.fspecs = (float_specs *)local_ad;
      local_68.decimal_point = (char *)&local_a0;
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_4_&>
                        (out,specs,sVar5,sVar5,(anon_class_48_6_9afe1116 *)&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}